

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void slot_error(char *error_string,Am_Object_Data *object_data,Am_Slot_Key key)

{
  uint *puVar1;
  ostream *poVar2;
  Am_Object object;
  Am_Object local_18;
  
  puVar1 = &(object_data->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 + 1;
  local_18.data = object_data;
  poVar2 = std::operator<<((ostream *)&std::cerr,"** ");
  poVar2 = std::operator<<(poVar2,error_string);
  poVar2 = std::operator<<(poVar2,"  Object = ");
  Am_Object::Print(&local_18,poVar2);
  std::operator<<(poVar2,", Slot = ");
  Am_Print_Key((ostream *)&std::cerr,key);
  poVar2 = std::operator<<((ostream *)&std::cerr,".");
  std::endl<char,std::char_traits<char>>(poVar2);
  Am_Error(&local_18,key);
}

Assistant:

void
slot_error(const char *error_string, Am_Object_Data *object_data,
           Am_Slot_Key key)
{
  object_data->Note_Reference();
  Am_Object object = object_data;
  std::cerr << "** " << error_string << "  Object = " << object << ", Slot = ";
  Am_Print_Key(std::cerr, key);
  std::cerr << "." << std::endl;
  Am_Error(object, key);
}